

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_w,float default_h)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [16];
  ImGuiWindow *window;
  ImGuiContext *g;
  float fVar3;
  undefined1 auVar5 [16];
  ImVec2 IVar4;
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  
  auVar7._4_60_ = in_register_00001284;
  auVar7._0_4_ = default_h;
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = size;
  auVar5 = auVar6._0_16_;
  pIVar1 = GImGui->CurrentWindow;
  fVar3 = size.x;
  if (fVar3 < 0.0) {
LAB_0015d493:
    IVar4 = (pIVar1->ContentRegionRect).Max;
    auVar8._8_8_ = 0;
    auVar8._0_4_ = IVar4.x;
    auVar8._4_4_ = IVar4.y;
    if (((pIVar1->DC).CurrentColumns != (ImGuiOldColumns *)0x0) ||
       (GImGui->CurrentTable != (ImGuiTable *)0x0)) {
      auVar8._4_4_ = IVar4.y;
      auVar8._0_4_ = (pIVar1->WorkRect).Max.x;
      auVar8._8_8_ = 0;
    }
  }
  else {
    auVar2 = vmovshdup_avx(auVar5);
    auVar8 = ZEXT816(0) << 0x40;
    if (auVar2._0_4_ < 0.0) goto LAB_0015d493;
  }
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    if (0.0 <= fVar3) goto LAB_0015d4e9;
    auVar5 = vmaxss_avx(SUB6416(ZEXT464(0x40800000),0),
                        ZEXT416((uint)(fVar3 + (auVar8._0_4_ - (pIVar1->DC).CursorPos.x))));
    default_w = auVar5._0_4_;
  }
  auVar5._4_12_ = auVar6._4_12_;
  auVar5._0_4_ = default_w;
LAB_0015d4e9:
  IVar4 = auVar5._0_8_;
  auVar2 = vmovshdup_avx(auVar5);
  fVar3 = auVar2._0_4_;
  if ((fVar3 == 0.0) && (!NAN(fVar3))) {
    auVar5 = vinsertps_avx(auVar5,auVar7._0_16_,0x10);
    return auVar5._0_8_;
  }
  if (fVar3 < 0.0) {
    auVar2 = vmovshdup_avx(auVar8);
    auVar2 = vmaxss_avx(SUB6416(ZEXT464(0x40800000),0),
                        ZEXT416((uint)(fVar3 + (auVar2._0_4_ - (pIVar1->DC).CursorPos.y))));
    auVar5 = vinsertps_avx(auVar5,auVar2,0x10);
    IVar4 = auVar5._0_8_;
  }
  return IVar4;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_w, float default_h)
{
    ImGuiWindow* window = GImGui->CurrentWindow;

    ImVec2 region_max;
    if (size.x < 0.0f || size.y < 0.0f)
        region_max = GetContentRegionMaxAbs();

    if (size.x == 0.0f)
        size.x = default_w;
    else if (size.x < 0.0f)
        size.x = ImMax(4.0f, region_max.x - window->DC.CursorPos.x + size.x);

    if (size.y == 0.0f)
        size.y = default_h;
    else if (size.y < 0.0f)
        size.y = ImMax(4.0f, region_max.y - window->DC.CursorPos.y + size.y);

    return size;
}